

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QRingChunk>::reallocateAndGrow
          (QArrayDataPointer<QRingChunk> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QRingChunk> *old)

{
  long lVar1;
  bool bVar2;
  QGenericArrayOps<QRingChunk> *this_00;
  QRingChunk *b;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QRingChunk> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QRingChunk> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QRingChunk *in_stack_ffffffffffffff80;
  QRingChunk *in_stack_ffffffffffffff88;
  QGenericArrayOps<QRingChunk> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QRingChunk> *)in_stack_ffffffffffffff80), bVar2)) ||
     (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QRingChunk> *)&DAT_aaaaaaaaaaaaaaaa,-0x5555555555555556,
                 0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QRingChunk> *)in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QRingChunk> *)
                  operator->((QArrayDataPointer<QRingChunk> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QRingChunk> *)0x20d11c);
        begin((QArrayDataPointer<QRingChunk> *)0x20d12b);
        QtPrivate::QGenericArrayOps<QRingChunk>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QRingChunk *)operator->((QArrayDataPointer<QRingChunk> *)&stack0xffffffffffffffe0);
        b = begin((QArrayDataPointer<QRingChunk> *)0x20d161);
        begin((QArrayDataPointer<QRingChunk> *)0x20d170);
        QtPrivate::QGenericArrayOps<QRingChunk>::moveAppend
                  (in_stack_ffffffffffffff90,b,in_stack_ffffffffffffff80);
      }
    }
    swap((QArrayDataPointer<QRingChunk> *)in_stack_ffffffffffffff80,
         (QArrayDataPointer<QRingChunk> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QRingChunk> *)in_stack_ffffffffffffff80,
           (QArrayDataPointer<QRingChunk> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer((QArrayDataPointer<QRingChunk> *)in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<QRingChunk> *)in_stack_ffffffffffffff80);
    freeSpaceAtEnd((QArrayDataPointer<QRingChunk> *)in_stack_ffffffffffffff88);
    QtPrivate::QMovableArrayOps<QRingChunk>::reallocate
              ((QMovableArrayOps<QRingChunk> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }